

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxpool.h
# Opt level: O2

void __thiscall cxxpool::thread_pool::~thread_pool(thread_pool *this)

{
  int in_EDX;
  int in_ESI;
  
  shutdown(this,in_ESI,in_EDX);
  std::condition_variable::~condition_variable(&this->task_cond_var_);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&this->task_counter_);
  std::vector<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>::
  ~vector(&(this->tasks_).c);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->threads_);
  return;
}

Assistant:

~thread_pool() {
        shutdown();
    }